

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::collate_impl(collate_impl<wchar_t> *this,cdata *d)

{
  pointer pcVar1;
  long lVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::collate<wchar_t>::collate((ulong)this);
  *(undefined ***)&this->super_collator<wchar_t> = &PTR__collate_impl_001d1d90;
  pcVar1 = (d->encoding)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (d->encoding)._M_string_length);
  (this->cvt_).mode_ = cvt_skip;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  icu_70::Locale::Locale(&this->locale_,&d->locale);
  lVar2 = 0;
  do {
    booster::details::make_key
              ((details *)((long)&this->collates_[0].key_.p_ + lVar2),
               thread_specific_ptr<icu_70::Collator>::destructor);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x28);
  this->is_utf8_ = d->utf8;
  return;
}

Assistant:

collate_impl(cdata const &d) : 
                    cvt_(d.encoding),
                    locale_(d.locale),
                    is_utf8_(d.utf8)
                {
                
                }